

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O2

void __thiscall
OpenMD::PotVecAccumulator::get95percentConfidenceInterval(PotVecAccumulator *this,ResultType *ret)

{
  size_t sVar1;
  uint i;
  long lVar2;
  ResultType sd;
  Vector<double,_7U> local_50;
  
  Vector<double,_7U>::Vector(&local_50);
  getStdDev(this,&local_50);
  sVar1 = (this->super_BaseAccumulator).Count_;
  for (lVar2 = 0; lVar2 != 7; lVar2 = lVar2 + 1) {
    ret->data_[lVar2] =
         (local_50.data_[lVar2] * 1.96) /
         SQRT(((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  }
  return;
}

Assistant:

void get95percentConfidenceInterval(ResultType& ret) {
      assert(Count_ != 0);
      ResultType sd;
      this->getStdDev(sd);
      for (unsigned int i = 0; i < N_INTERACTION_FAMILIES; i++) {
        ret[i] = 1.960 * sd[i] / sqrt(RealType(Count_));
      }
      return;
    }